

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_tools.cxx
# Opt level: O0

void __thiscall object_tools::save_bones(object_tools *this,xr_object *object,char *source)

{
  bool bVar1;
  uint uVar2;
  xr_bone_vec *this_00;
  undefined8 uVar3;
  undefined1 local_40 [8];
  string target;
  char *source_local;
  xr_object *object_local;
  object_tools *this_local;
  
  target.field_2._8_8_ = source;
  this_00 = xray_re::xr_object::bones(object);
  bVar1 = std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>::empty(this_00);
  if (bVar1) {
    xray_re::msg("game object has no bones");
  }
  else {
    std::__cxx11::string::string((string *)local_40);
    batch_helper::make_target_name
              (&this->super_batch_helper,(string *)local_40,(char *)target.field_2._8_8_,".bones");
    uVar3 = std::__cxx11::string::c_str();
    uVar2 = (*(object->super_xr_surface_factory)._vptr_xr_surface_factory[0xe])(object,uVar3);
    if ((uVar2 & 1) == 0) {
      uVar3 = std::__cxx11::string::c_str();
      xray_re::msg("can\'t save bones in %s",uVar3);
    }
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void object_tools::save_bones(xray_re::xr_object& object, const char* source) const
{
	if (object.bones().empty()) {
		msg("game object has no bones");
	} else {
		std::string target;
		make_target_name(target, source, ".bones");
		if (!object.save_bones(target.c_str()))
			msg("can't save bones in %s", target.c_str());
	}
}